

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::
ValidationErrorTest_ExtensionDeclarationsFullNameDoesNotLookLikeIdentifier_Test::
~ValidationErrorTest_ExtensionDeclarationsFullNameDoesNotLookLikeIdentifier_Test
          (ValidationErrorTest_ExtensionDeclarationsFullNameDoesNotLookLikeIdentifier_Test *this)

{
  ValidationErrorTest_ExtensionDeclarationsFullNameDoesNotLookLikeIdentifier_Test *this_local;
  
  ~ValidationErrorTest_ExtensionDeclarationsFullNameDoesNotLookLikeIdentifier_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest,
       ExtensionDeclarationsFullNameDoesNotLookLikeIdentifier) {
  BuildFileWithErrors(
      R"pb(
        name: "foo.proto"
        message_type {
          name: "Foo"
          extension_range {
            start: 10
            end: 11
            options: {
              declaration: {
                number: 10
                full_name: ".ext..test.bar"
                type: ".baz"
              }
            }
          }
        }
      )pb",
      "foo.proto: Foo: NAME: \".ext..test.bar\" contains invalid "
      "identifiers.\n");
}